

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall
fixedMeasurement_invalid_Test::~fixedMeasurement_invalid_Test(fixedMeasurement_invalid_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(fixedMeasurement, invalid)
{
    fixed_measurement iv1(1.2, invalid);
    EXPECT_FALSE(is_valid(iv1));
    EXPECT_FALSE(isnormal(iv1));

    fixed_measurement iv2(constants::invalid_conversion, m);
    EXPECT_FALSE(is_valid(iv2));
    EXPECT_FALSE(isnormal(iv2));

    fixed_measurement iv3(constants::infinity, m);
    EXPECT_TRUE(is_valid(iv3));
    EXPECT_FALSE(isnormal(iv3));

    fixed_measurement iv4(1e-311, m);  // subnormal
    EXPECT_TRUE(is_valid(iv4));
    EXPECT_FALSE(isnormal(iv4));

    fixed_measurement iv5(0.0, m);
    EXPECT_TRUE(is_valid(iv5));
    EXPECT_TRUE(isnormal(iv5));
}